

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O2

int stb_vorbis_get_frame_short(stb_vorbis *f,int num_c,short **buffer,int num_samples)

{
  int iVar1;
  float **output;
  float **local_28;
  
  local_28 = (float **)0x0;
  iVar1 = stb_vorbis_get_frame_float(f,(int *)0x0,&local_28);
  if (iVar1 < num_samples) {
    num_samples = iVar1;
  }
  if (num_samples != 0) {
    convert_samples_short(num_c,buffer,0,f->channels,local_28,0,num_samples);
  }
  return num_samples;
}

Assistant:

int stb_vorbis_get_frame_short(stb_vorbis *f, int num_c, short **buffer, int num_samples)
{
   float **output = NULL;
   int len = stb_vorbis_get_frame_float(f, NULL, &output);
   if (len > num_samples) len = num_samples;
   if (len)
      convert_samples_short(num_c, buffer, 0, f->channels, output, 0, len);
   return len;
}